

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

bool slang::syntax::DistItemBaseSyntax::isKind(SyntaxKind kind)

{
  return kind == DistItem || kind == DefaultDistItem;
}

Assistant:

bool DistItemBaseSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::DefaultDistItem:
        case SyntaxKind::DistItem:
            return true;
        default:
            return false;
    }
}